

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O3

void duckdb::SortedAggregateFunction::Finalize
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  vector<duckdb::LogicalType,_true> *__x;
  SortedAggregateBindData *order_bind;
  value_type vVar1;
  pointer pBVar2;
  SortedAggregateState *this;
  undefined8 uVar3;
  _Head_base<0UL,_duckdb::LocalSortState_*,_false> _Var4;
  pointer pVVar5;
  int iVar6;
  BufferManager *pBVar7;
  undefined4 extraout_var;
  idx_t iVar8;
  reference pvVar9;
  BoundConstantExpression *this_00;
  __uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_> this_01;
  pointer pGVar10;
  LocalSortState *pLVar11;
  pointer pLVar12;
  type pGVar13;
  reference pvVar14;
  type pLVar15;
  GlobalSortState *this_02;
  pointer pPVar16;
  pointer pRVar17;
  reference other;
  tuple<duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_> this_03;
  ulong uVar18;
  pointer __p;
  size_type sVar19;
  pointer this_04;
  size_type __n;
  long lVar20;
  bool bVar21;
  AggregateInputData aggr_bind_info;
  vector<duckdb::BoundOrderByNode,_true> orders;
  vector<unsigned_long,_true> state_unprocessed;
  vector<unsigned_char,_true> agg_state;
  DataChunk prefixed;
  DataChunk chunk;
  Vector agg_state_vec;
  DataChunk sliced;
  RowLayout payload_layout;
  BoundOrderByNode local_308;
  _Head_base<0UL,_duckdb::LocalSortState_*,_false> local_2f0;
  aggregate_destructor_t local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  Vector *local_2d0;
  Vector *local_2c8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2c0;
  idx_t local_2b8;
  aggregate_finalize_t local_2b0;
  aggregate_initialize_t local_2a8;
  AggregateFunction *local_2a0;
  AggregateInputData local_298;
  undefined1 local_280 [24];
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_268;
  undefined1 local_260 [16];
  _Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_> local_250;
  ClientContext *local_240;
  data_ptr_t local_238;
  GlobalSortState *local_230;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f0;
  DataChunk local_1d8;
  aggregate_update_t local_198;
  aggregate_simple_update_t local_190;
  DataChunk local_188;
  Vector local_148;
  DataChunk local_e0;
  vector<duckdb::LogicalType,_true> local_a0;
  RowLayout local_88;
  Allocator *allocator;
  
  local_2d0 = result;
  local_2c8 = states;
  local_2b8 = offset;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  order_bind = (SortedAggregateBindData *)(aggr_input_data->bind_data).ptr;
  local_240 = order_bind->context;
  RowLayout::RowLayout(&local_88);
  __x = &order_bind->arg_types;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a0,
             &__x->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize(&local_88,&local_a0,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_a0);
  pBVar7 = BufferManager::GetBufferManager(order_bind->context);
  iVar6 = (*pBVar7->_vptr_BufferManager[0x14])(pBVar7);
  allocator = (Allocator *)CONCAT44(extraout_var,iVar6);
  DataChunk::DataChunk(&local_188);
  DataChunk::Initialize(&local_188,allocator,__x,0x800);
  DataChunk::DataChunk(&local_e0);
  DataChunk::Initialize(&local_e0,allocator,__x,0x800);
  local_2a0 = &order_bind->function;
  iVar8 = (*(order_bind->function).state_size)(local_2a0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_1f0,iVar8,(allocator_type *)&local_148);
  Value::POINTER((Value *)&local_1d8,
                 (uintptr_t)
                 local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
  Vector::Vector(&local_148,(Value *)&local_1d8);
  Value::~Value((Value *)&local_1d8);
  local_298.bind_data.ptr =
       (order_bind->bind_info).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_298.allocator = aggr_input_data->allocator;
  local_298.combine_type = PRESERVE_INPUT;
  local_2a8 = (order_bind->function).initialize;
  local_198 = (order_bind->function).update;
  local_2e8 = (order_bind->function).destructor;
  local_190 = (order_bind->function).simple_update;
  local_2b0 = (order_bind->function).finalize;
  local_238 = local_2c8->data;
  local_1d8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_208,count,(value_type_conflict *)&local_1d8,(allocator_type *)local_280);
  if (count != 0) {
    sVar19 = 0;
    do {
      vVar1 = **(value_type **)(local_238 + sVar19 * 8);
      pvVar9 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)&local_208,sVar19);
      *pvVar9 = vVar1;
      sVar19 = sVar19 + 1;
    } while (count != sVar19);
  }
  local_228.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::USMALLINT((Value *)local_280,0);
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value((Value *)&local_1d8,(Value *)local_280);
  BoundConstantExpression::BoundConstantExpression(this_00,(Value *)&local_1d8);
  Value::~Value((Value *)&local_1d8);
  local_2c0._M_head_impl = (Expression *)this_00;
  BoundOrderByNode::BoundOrderByNode
            (&local_308,ASCENDING,NULLS_FIRST,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_2c0);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>(&local_228,&local_308);
  if ((_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)
      local_308.stats.
      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
      (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
    BaseStatistics::~BaseStatistics
              ((BaseStatistics *)
               local_308.stats.
               super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
               .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
    operator_delete((void *)local_308.stats.
                            super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                            .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl);
  }
  local_308.stats.
  super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
       (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
        )0x0;
  if (local_308.expression.
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)0x0)
  {
    (**(code **)(*(long *)local_308.expression.
                          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                          .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))();
  }
  local_308.expression.
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
       (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)0x0
  ;
  if ((BoundConstantExpression *)local_2c0._M_head_impl != (BoundConstantExpression *)0x0) {
    (*(((Expression *)&(local_2c0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  local_2c0._M_head_impl = (Expression *)0x0;
  Value::~Value((Value *)local_280);
  this_04 = (order_bind->orders).
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (order_bind->orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (this_04 != pBVar2) {
    do {
      BoundOrderByNode::Copy((BoundOrderByNode *)&local_1d8,this_04);
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
      emplace_back<duckdb::BoundOrderByNode>(&local_228,(BoundOrderByNode *)&local_1d8);
      pVVar5 = local_1d8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (local_1d8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        BaseStatistics::~BaseStatistics
                  ((BaseStatistics *)
                   local_1d8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        operator_delete(pVVar5);
      }
      local_1d8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_1d8.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        (**(code **)(*(long *)&(local_1d8.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish)->vector_type + 8))();
      }
      this_04 = this_04 + 1;
    } while (this_04 != pBVar2);
  }
  this_01._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>.
  super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>)
       operator_new(0x2b8);
  GlobalSortState::GlobalSortState
            ((GlobalSortState *)
             this_01._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
             .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl,local_240,
             (vector<duckdb::BoundOrderByNode,_true> *)&local_228,&local_88);
  bVar21 = order_bind->external;
  local_308._0_8_ =
       this_01._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
       .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl;
  pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
            ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                          *)&local_308);
  pGVar10->external = bVar21;
  pLVar11 = (LocalSortState *)operator_new(0xd0);
  LocalSortState::LocalSortState(pLVar11);
  local_2f0._M_head_impl = pLVar11;
  pLVar12 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>::
            operator->((unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                        *)&local_2f0);
  pGVar13 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
            ::operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                         *)&local_308);
  pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
            ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                          *)&local_308);
  LocalSortState::Initialize(pLVar12,pGVar13,pGVar10->buffer_manager);
  DataChunk::DataChunk(&local_1d8);
  pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
            ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                          *)&local_308);
  DataChunk::Initialize(&local_1d8,allocator,&(pGVar10->sort_layout).logical_types,0x800);
  local_2e0 = 0;
  sVar19 = 0;
  local_2d8 = 0;
  do {
    uVar18 = local_2d8;
    do {
      if (count <= uVar18) goto LAB_00ed836e;
      if (order_bind->threshold <= local_2e0) break;
      this = *(SortedAggregateState **)(local_238 + uVar18 * 8);
      DataChunk::Reset(&local_1d8);
      pvVar14 = vector<duckdb::Vector,_true>::operator[](&local_1d8.data,0);
      Value::USMALLINT((Value *)local_280,(uint16_t)uVar18);
      Vector::Reference(pvVar14,(Value *)local_280);
      Value::~Value((Value *)local_280);
      pLVar15 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                ::operator*((unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                             *)&local_2f0);
      SortedAggregateState::Finalize(this,order_bind,&local_1d8,pLVar15);
      pvVar9 = vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)&local_208,uVar18);
      local_2e0 = local_2e0 + *pvVar9;
      uVar18 = uVar18 + 1;
    } while (uVar18 < count);
    local_2d8 = uVar18;
    if (local_2e0 == 0) break;
    pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
              ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                            *)&local_308);
    pLVar15 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
              ::operator*((unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                           *)&local_2f0);
    GlobalSortState::AddLocalState(pGVar10,pLVar15);
    pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
              ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                            *)&local_308);
    GlobalSortState::PrepareMergePhase(pGVar10);
    while (pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                     ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                                   *)&local_308),
          8 < (ulong)((long)(pGVar10->sorted_blocks).
                            super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pGVar10->sorted_blocks).
                           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
      pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                              *)&local_308);
      GlobalSortState::InitializeMergeRound(pGVar10);
      pGVar13 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                             *)&local_308);
      pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                              *)&local_308);
      MergeSorter::MergeSorter((MergeSorter *)local_280,pGVar13,pGVar10->buffer_manager);
      MergeSorter::PerformInMergeRound((MergeSorter *)local_280);
      pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                              *)&local_308);
      GlobalSortState::CompleteMergeRound(pGVar10,false);
      if (local_250.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl !=
          (SortedBlock *)0x0) {
        ::std::default_delete<duckdb::SortedBlock>::operator()
                  ((default_delete<duckdb::SortedBlock> *)&local_250,
                   (SortedBlock *)
                   local_250.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
      }
      local_250.super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::SortedBlock_*,_false>)(SortedBlock *)0x0;
      if ((SortedBlock *)local_260._8_8_ != (SortedBlock *)0x0) {
        ::std::default_delete<duckdb::SortedBlock>::operator()
                  ((default_delete<duckdb::SortedBlock> *)(local_260 + 8),
                   (SortedBlock *)local_260._8_8_);
      }
      local_260._8_8_ = (SortedBlock *)0x0;
      if ((SBScanState *)local_260._0_8_ != (SBScanState *)0x0) {
        ::std::default_delete<duckdb::SBScanState>::operator()
                  ((default_delete<duckdb::SBScanState> *)local_260,(SBScanState *)local_260._0_8_);
      }
      local_260._0_8_ = (SBScanState *)0x0;
      if (local_268._M_head_impl != (SBScanState *)0x0) {
        ::std::default_delete<duckdb::SBScanState>::operator()
                  ((default_delete<duckdb::SBScanState> *)&local_268,local_268._M_head_impl);
      }
    }
    pGVar13 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
              ::operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                           *)&local_308);
    this_02 = (GlobalSortState *)operator_new(0x18);
    PayloadScanner::PayloadScanner((PayloadScanner *)this_02,pGVar13,true);
    local_280._0_8_ = this_02;
    (*local_2a8)(local_2a0,
                 local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
    while( true ) {
      pPVar16 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                ::operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                              *)local_280);
      pRVar17 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                ::operator->(&pPVar16->scanner);
      if (pRVar17->total_count == pRVar17->total_scanned) break;
      DataChunk::Reset(&local_188);
      pPVar16 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                ::operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                              *)local_280);
      PayloadScanner::Scan(pPVar16,&local_188);
      if (local_188.count != 0) {
        iVar8 = 0;
        do {
          while (pvVar9 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)&local_208,sVar19), *pvVar9 == 0
                ) {
            Vector::SetVectorType(&local_148,local_2c8->vector_type);
            (*local_2b0)(&local_148,&local_298,local_2d0,1,local_2b8 + sVar19);
            if (local_2e8 != (aggregate_destructor_t)0x0) {
              (*local_2e8)(&local_148,&local_298,1);
            }
            (*local_2a8)(local_2a0,
                         local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            sVar19 = sVar19 + 1;
          }
          pvVar9 = vector<unsigned_long,_true>::operator[]
                             ((vector<unsigned_long,_true> *)&local_208,sVar19);
          uVar18 = local_188.count - iVar8;
          if (*pvVar9 < local_188.count - iVar8) {
            uVar18 = *pvVar9;
          }
          if (local_188.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_188.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start) {
            __n = 0;
            do {
              pvVar14 = vector<duckdb::Vector,_true>::operator[](&local_e0.data,__n);
              other = vector<duckdb::Vector,_true>::operator[](&local_188.data,__n);
              Vector::Slice(pvVar14,other,iVar8,uVar18 + iVar8);
              __n = __n + 1;
            } while (__n < (ulong)(((long)local_188.data.
                                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          .
                                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_188.data.
                                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          .
                                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                  0x4ec4ec4ec4ec4ec5));
          }
          local_e0.count = uVar18;
          if (local_190 == (aggregate_simple_update_t)0x0) {
            Vector::SetVectorType(&local_148,CONSTANT_VECTOR);
            (*local_198)(local_e0.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                         .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_298,
                         ((long)local_e0.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_e0.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5,
                         &local_148,local_e0.count);
          }
          else {
            (*local_190)(local_e0.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                         .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_298,
                         ((long)local_e0.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_e0.data.
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5,
                         local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,uVar18);
          }
          pvVar9 = vector<unsigned_long,_true>::operator[]
                             ((vector<unsigned_long,_true> *)&local_208,sVar19);
          *pvVar9 = *pvVar9 - uVar18;
          iVar8 = iVar8 + uVar18;
        } while (iVar8 < local_188.count);
      }
    }
    Vector::SetVectorType(&local_148,local_2c8->vector_type);
    (*local_2b0)(&local_148,&local_298,local_2d0,1,local_2b8 + sVar19);
    if (local_2e8 != (aggregate_destructor_t)0x0) {
      (*local_2e8)(&local_148,&local_298,1);
    }
    uVar3 = local_280._0_8_;
    if (local_2d8 < count) {
      local_280._0_8_ = (GlobalSortState *)0x0;
      if ((GlobalSortState *)uVar3 != (GlobalSortState *)0x0) {
        ::std::default_delete<duckdb::PayloadScanner>::operator()
                  ((default_delete<duckdb::PayloadScanner> *)local_280,(PayloadScanner *)uVar3);
      }
      this_03.
      super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
      .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
            )operator_new(0x2b8);
      GlobalSortState::GlobalSortState
                ((GlobalSortState *)
                 this_03.
                 super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
                 .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl,local_240,
                 (vector<duckdb::BoundOrderByNode,_true> *)&local_228,&local_88);
      uVar3 = local_308._0_8_;
      local_230 = (GlobalSortState *)0x0;
      bVar21 = (__uniq_ptr_data<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true,_true>
                )local_308._0_8_ !=
               (tuple<duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>)0x0;
      local_308._0_8_ =
           this_03.
           super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
           .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl;
      if ((bVar21) &&
         (::std::default_delete<duckdb::GlobalSortState>::operator()
                    ((default_delete<duckdb::GlobalSortState> *)&local_308,(GlobalSortState *)uVar3)
         , local_230 != (GlobalSortState *)0x0)) {
        ::std::default_delete<duckdb::GlobalSortState>::operator()
                  ((default_delete<duckdb::GlobalSortState> *)&local_230,local_230);
      }
      bVar21 = order_bind->external;
      pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                              *)&local_308);
      pGVar10->external = bVar21;
      pLVar11 = (LocalSortState *)operator_new(0xd0);
      LocalSortState::LocalSortState(pLVar11);
      _Var4._M_head_impl = local_2f0._M_head_impl;
      bVar21 = local_2f0._M_head_impl != (LocalSortState *)0x0;
      local_2f0._M_head_impl = pLVar11;
      if (bVar21) {
        LocalSortState::~LocalSortState(_Var4._M_head_impl);
        operator_delete(_Var4._M_head_impl);
      }
      pLVar12 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                ::operator->((unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
                              *)&local_2f0);
      pGVar13 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                             *)&local_308);
      pGVar10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                ::operator->((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                              *)&local_308);
      LocalSortState::Initialize(pLVar12,pGVar13,pGVar10->buffer_manager);
      local_2e0 = 0;
    }
    if ((GlobalSortState *)local_280._0_8_ != (GlobalSortState *)0x0) {
      ::std::default_delete<duckdb::PayloadScanner>::operator()
                ((default_delete<duckdb::PayloadScanner> *)local_280,
                 (PayloadScanner *)local_280._0_8_);
    }
    sVar19 = sVar19 + 1;
  } while (local_2d8 < count);
LAB_00ed836e:
  lVar20 = count - sVar19;
  if (sVar19 <= count && lVar20 != 0) {
    iVar8 = sVar19 + local_2b8;
    do {
      (*local_2a8)(local_2a0,
                   local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      Vector::SetVectorType(&local_148,local_2c8->vector_type);
      (*local_2b0)(&local_148,&local_298,local_2d0,1,iVar8);
      if (local_2e8 != (aggregate_destructor_t)0x0) {
        (*local_2e8)(&local_148,&local_298,1);
      }
      iVar8 = iVar8 + 1;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  Vector::Verify(local_2d0,count);
  DataChunk::~DataChunk(&local_1d8);
  _Var4._M_head_impl = local_2f0._M_head_impl;
  if (local_2f0._M_head_impl != (LocalSortState *)0x0) {
    LocalSortState::~LocalSortState(local_2f0._M_head_impl);
    operator_delete(_Var4._M_head_impl);
  }
  if ((GlobalSortState *)local_308._0_8_ != (GlobalSortState *)0x0) {
    ::std::default_delete<duckdb::GlobalSortState>::operator()
              ((default_delete<duckdb::GlobalSortState> *)&local_308,
               (GlobalSortState *)local_308._0_8_);
  }
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&local_228);
  if (local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_148.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_148.type);
  if (local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (data_ptr_t)0x0) {
    operator_delete(local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  DataChunk::~DataChunk(&local_e0);
  DataChunk::~DataChunk(&local_188);
  if (local_88.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88);
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     const idx_t offset) {
		auto &order_bind = aggr_input_data.bind_data->Cast<SortedAggregateBindData>();
		auto &context = order_bind.context;
		RowLayout payload_layout;
		payload_layout.Initialize(order_bind.arg_types);

		auto &buffer_allocator = BufferManager::GetBufferManager(order_bind.context).GetBufferAllocator();
		DataChunk chunk;
		chunk.Initialize(buffer_allocator, order_bind.arg_types);
		DataChunk sliced;
		sliced.Initialize(buffer_allocator, order_bind.arg_types);

		//	 Reusable inner state
		auto &aggr = order_bind.function;
		vector<data_t> agg_state(aggr.state_size(aggr));
		Vector agg_state_vec(Value::POINTER(CastPointerToValue(agg_state.data())));

		// State variables
		auto bind_info = order_bind.bind_info.get();
		AggregateInputData aggr_bind_info(bind_info, aggr_input_data.allocator);

		// Inner aggregate APIs
		auto initialize = aggr.initialize;
		auto destructor = aggr.destructor;
		auto simple_update = aggr.simple_update;
		auto update = aggr.update;
		auto finalize = aggr.finalize;

		auto sdata = FlatVector::GetData<SortedAggregateState *>(states);

		vector<idx_t> state_unprocessed(count, 0);
		for (idx_t i = 0; i < count; ++i) {
			state_unprocessed[i] = sdata[i]->count;
		}

		// Sort the input payloads on (state_idx ASC, orders)
		vector<BoundOrderByNode> orders;
		orders.emplace_back(BoundOrderByNode(OrderType::ASCENDING, OrderByNullType::NULLS_FIRST,
		                                     make_uniq<BoundConstantExpression>(Value::USMALLINT(0))));
		for (const auto &order : order_bind.orders) {
			orders.emplace_back(order.Copy());
		}

		auto global_sort = make_uniq<GlobalSortState>(context, orders, payload_layout);
		global_sort->external = order_bind.external;
		auto local_sort = make_uniq<LocalSortState>();
		local_sort->Initialize(*global_sort, global_sort->buffer_manager);

		DataChunk prefixed;
		prefixed.Initialize(buffer_allocator, global_sort->sort_layout.logical_types);

		//	Go through the states accumulating values to sort until we hit the sort threshold
		idx_t unsorted_count = 0;
		idx_t sorted = 0;
		for (idx_t finalized = 0; finalized < count;) {
			if (unsorted_count < order_bind.threshold) {
				auto state = sdata[finalized];
				prefixed.Reset();
				prefixed.data[0].Reference(Value::USMALLINT(UnsafeNumericCast<uint16_t>(finalized)));
				state->Finalize(order_bind, prefixed, *local_sort);
				unsorted_count += state_unprocessed[finalized];

				// Go to the next aggregate unless this is the last one
				if (++finalized < count) {
					continue;
				}
			}

			//	If they were all empty (filtering) flush them
			//	(This can only happen on the last range)
			if (!unsorted_count) {
				break;
			}

			//	Sort all the data
			global_sort->AddLocalState(*local_sort);
			global_sort->PrepareMergePhase();
			while (global_sort->sorted_blocks.size() > 1) {
				global_sort->InitializeMergeRound();
				MergeSorter merge_sorter(*global_sort, global_sort->buffer_manager);
				merge_sorter.PerformInMergeRound();
				global_sort->CompleteMergeRound(false);
			}

			auto scanner = make_uniq<PayloadScanner>(*global_sort);
			initialize(aggr, agg_state.data());
			while (scanner->Remaining()) {
				chunk.Reset();
				scanner->Scan(chunk);
				idx_t consumed = 0;

				// Distribute the scanned chunk to the aggregates
				while (consumed < chunk.size()) {
					//	Find the next aggregate that needs data
					for (; !state_unprocessed[sorted]; ++sorted) {
						// Finalize a single value at the next offset
						agg_state_vec.SetVectorType(states.GetVectorType());
						finalize(agg_state_vec, aggr_bind_info, result, 1, sorted + offset);
						if (destructor) {
							destructor(agg_state_vec, aggr_bind_info, 1);
						}

						initialize(aggr, agg_state.data());
					}
					const auto input_count = MinValue(state_unprocessed[sorted], chunk.size() - consumed);
					for (column_t col_idx = 0; col_idx < chunk.ColumnCount(); ++col_idx) {
						sliced.data[col_idx].Slice(chunk.data[col_idx], consumed, consumed + input_count);
					}
					sliced.SetCardinality(input_count);

					// These are all simple updates, so use it if available
					if (simple_update) {
						simple_update(sliced.data.data(), aggr_bind_info, sliced.data.size(), agg_state.data(),
						              sliced.size());
					} else {
						// We are only updating a constant state
						agg_state_vec.SetVectorType(VectorType::CONSTANT_VECTOR);
						update(sliced.data.data(), aggr_bind_info, sliced.data.size(), agg_state_vec, sliced.size());
					}

					consumed += input_count;
					state_unprocessed[sorted] -= input_count;
				}
			}

			//	Finalize the last state for this sort
			agg_state_vec.SetVectorType(states.GetVectorType());
			finalize(agg_state_vec, aggr_bind_info, result, 1, sorted + offset);
			if (destructor) {
				destructor(agg_state_vec, aggr_bind_info, 1);
			}
			++sorted;

			//	Stop if we are done
			if (finalized >= count) {
				break;
			}

			//	Create a new sort
			scanner.reset();
			global_sort = make_uniq<GlobalSortState>(context, orders, payload_layout);
			global_sort->external = order_bind.external;
			local_sort = make_uniq<LocalSortState>();
			local_sort->Initialize(*global_sort, global_sort->buffer_manager);
			unsorted_count = 0;
		}

		for (; sorted < count; ++sorted) {
			initialize(aggr, agg_state.data());

			// Finalize a single value at the next offset
			agg_state_vec.SetVectorType(states.GetVectorType());
			finalize(agg_state_vec, aggr_bind_info, result, 1, sorted + offset);

			if (destructor) {
				destructor(agg_state_vec, aggr_bind_info, 1);
			}
		}

		result.Verify(count);
	}